

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_hexenspecialdecs.cpp
# Opt level: O3

int AF_A_PotteryChooseBit(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  PClass *pPVar6;
  FState *pFVar7;
  AActor *this;
  VMValue *pVVar8;
  char *__assertion;
  bool bVar9;
  bool bVar10;
  FName local_2c;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005e21db;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this == (AActor *)0x0) {
LAB_005e208e:
        this = (AActor *)0x0;
        pVVar8 = param;
        uVar5 = numparam;
      }
      else {
        pPVar6 = (this->super_DThinker).super_DObject.Class;
        if (pPVar6 == (PClass *)0x0) {
          iVar4 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
          pPVar6 = (PClass *)CONCAT44(extraout_var,iVar4);
          (this->super_DThinker).super_DObject.Class = pPVar6;
        }
        bVar9 = pPVar6 == (PClass *)0x0;
        ret = (VMReturn *)(ulong)!bVar9;
        bVar10 = pPVar6 == pPVar3;
        if (!bVar10 && !bVar9) {
          do {
            pPVar6 = pPVar6->ParentClass;
            ret = (VMReturn *)(ulong)(pPVar6 != (PClass *)0x0);
            if (pPVar6 == pPVar3) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        pVVar8 = (VMValue *)(ulong)(bVar10 || bVar9);
        uVar5 = (uint)bVar9;
        if ((char)ret == '\0') {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005e21db;
        }
      }
      pPVar3 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_005e214e;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_005e21cb;
        puVar2 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar2 != (undefined8 *)0x0) {
            pPVar6 = (PClass *)puVar2[1];
            if (pPVar6 == (PClass *)0x0) {
              pPVar6 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar8,uVar5,ret);
              puVar2[1] = pPVar6;
            }
            bVar9 = pPVar6 != (PClass *)0x0;
            if (pPVar6 != pPVar3 && bVar9) {
              do {
                pPVar6 = pPVar6->ParentClass;
                bVar9 = pPVar6 != (PClass *)0x0;
                if (pPVar6 == pPVar3) break;
              } while (pPVar6 != (PClass *)0x0);
            }
            if (!bVar9) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005e21db;
            }
          }
        }
        else if (puVar2 != (undefined8 *)0x0) goto LAB_005e21cb;
      }
      if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005e214e:
        local_2c.Index = 0x87;
        pFVar7 = AActor::FindState(this,&local_2c);
        uVar5 = FRandom::GenRand32(&pr_bit);
        AActor::SetState(this,pFVar7 + (ulong)(byte)(((char)uVar5 + (char)((uVar5 & 0xff) / 5) * -5)
                                                    * '\x02') + 1,false);
        uVar5 = FRandom::GenRand32(&pr_bit);
        this->tics = (uVar5 & 0xff) * 2 + 0x100;
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005e21db;
    }
    if (this == (AActor *)0x0) goto LAB_005e208e;
  }
LAB_005e21cb:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005e21db:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_hexenspecialdecs.cpp"
                ,0x60,"int AF_A_PotteryChooseBit(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_PotteryChooseBit)
{
	PARAM_ACTION_PROLOGUE;

	self->SetState (self->FindState(NAME_Death) + 1 + 2*(pr_bit()%5));
	self->tics = 256+(pr_bit()<<1);
	return 0;
}